

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O3

void __thiscall QPDFWriter::assignCompressedObjectNumbers(QPDFWriter *this,QPDFObjGen og)

{
  int iVar1;
  element_type *peVar2;
  pointer pQVar3;
  long lVar4;
  _Base_ptr p_Var5;
  mapped_type *pmVar6;
  Object *pOVar7;
  _Base_ptr p_Var8;
  ulong uVar9;
  _Base_ptr p_Var10;
  ulong idx;
  QPDFObjGen *iter;
  pointer pQVar11;
  int objid;
  int local_2c;
  
  local_2c = og.obj;
  if ((ulong)og >> 0x20 == 0) {
    peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var8 = *(_Base_ptr *)
              ((long)&(peVar2->object_stream_to_objects)._M_t._M_impl.super__Rb_tree_header + 8);
    if (p_Var8 != (_Base_ptr)0x0) {
      p_Var5 = &(peVar2->object_stream_to_objects)._M_t._M_impl.super__Rb_tree_header._M_header;
      p_Var10 = p_Var5;
      do {
        if (local_2c <= (int)p_Var8[1]._M_color) {
          p_Var10 = p_Var8;
        }
        p_Var8 = (&p_Var8->_M_left)[(int)p_Var8[1]._M_color < local_2c];
      } while (p_Var8 != (_Base_ptr)0x0);
      if ((p_Var10 != p_Var5) && ((int)p_Var10[1]._M_color <= local_2c)) {
        pmVar6 = std::
                 map<int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<QPDFObjGen,_std::allocator<QPDFObjGen>_>_>_>_>
                 ::operator[](&peVar2->object_stream_to_objects,&local_2c);
        pQVar3 = (pmVar6->super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        for (pQVar11 = (pmVar6->super__Vector_base<QPDFObjGen,_std::allocator<QPDFObjGen>_>)._M_impl
                       .super__Vector_impl_data._M_start; pQVar11 != pQVar3; pQVar11 = pQVar11 + 1)
        {
          peVar2 = (this->m).super___shared_ptr<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar1 = peVar2->next_objid;
          peVar2->next_objid = iVar1 + 1;
          idx = (ulong)pQVar11->obj;
          lVar4 = *(long *)&(peVar2->obj).super_ObjTable<QPDFWriter::Object>.
                            super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>.
                            super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                            ._M_impl;
          uVar9 = ((long)*(pointer *)
                          ((long)&(peVar2->obj).super_ObjTable<QPDFWriter::Object>.
                                  super_vector<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                                  .
                                  super__Vector_base<QPDFWriter::Object,_std::allocator<QPDFWriter::Object>_>
                          + 8) - lVar4 >> 2) * -0x5555555555555555;
          if (uVar9 < idx || uVar9 - idx == 0) {
            pOVar7 = ObjTable<QPDFWriter::Object>::large_element
                               (&(peVar2->obj).super_ObjTable<QPDFWriter::Object>,idx);
          }
          else {
            pOVar7 = (Object *)(lVar4 + idx * 0xc);
          }
          pOVar7->renumber = iVar1;
        }
      }
    }
  }
  return;
}

Assistant:

void
QPDFWriter::assignCompressedObjectNumbers(QPDFObjGen og)
{
    int objid = og.getObj();
    if ((og.getGen() != 0) || (m->object_stream_to_objects.count(objid) == 0)) {
        // This is not an object stream.
        return;
    }

    // Reserve numbers for the objects that belong to this object stream.
    for (auto const& iter: m->object_stream_to_objects[objid]) {
        m->obj[iter].renumber = m->next_objid++;
    }
}